

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkUtil.c
# Opt level: O2

int Nwk_ManMinimumBaseNode(Nwk_Obj_t *pObj,Vec_Int_t *vTruth,int fVerbose)

{
  Nwk_Man_t *p;
  int nFanins;
  uint uSupp;
  uint *pTruth;
  Nwk_Obj_t *pNodeNew;
  Hop_Obj_t *pHVar1;
  long lVar2;
  int iVar3;
  
  p = pObj->pMan;
  iVar3 = 0;
  pTruth = Hop_ManConvertAigToTruth
                     (p->pManHop,(Hop_Obj_t *)((ulong)pObj->pFunc & 0xfffffffffffffffe),
                      pObj->nFanins,vTruth,0);
  nFanins = Kit_TruthSupportSize(pTruth,pObj->nFanins);
  if (nFanins != pObj->nFanins) {
    uSupp = Kit_TruthSupport(pTruth,pObj->nFanins);
    pNodeNew = Nwk_ManCreateNode(p,nFanins,pObj->nFanouts);
    for (lVar2 = 0; (lVar2 < pObj->nFanins && (pObj->pFanio[lVar2] != (Nwk_Obj_t *)0x0));
        lVar2 = lVar2 + 1) {
      if ((uSupp >> ((uint)lVar2 & 0x1f) & 1) != 0) {
        Nwk_ObjAddFanin(pNodeNew,pObj->pFanio[lVar2]);
      }
    }
    pHVar1 = Hop_Remap(p->pManHop,pObj->pFunc,uSupp,pObj->nFanins);
    pNodeNew->pFunc = pHVar1;
    if (fVerbose != 0) {
      printf("Reducing node %d fanins from %d to %d.\n",(ulong)(uint)pObj->Id,
             (ulong)(uint)pObj->nFanins,(ulong)(uint)pNodeNew->nFanins);
    }
    Nwk_ObjReplace(pObj,pNodeNew);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int Nwk_ManMinimumBaseNode( Nwk_Obj_t * pObj, Vec_Int_t * vTruth, int fVerbose )
{
    unsigned * pTruth;
    Nwk_Obj_t * pFanin, * pObjNew;
    Nwk_Man_t * pNtk = pObj->pMan;
    int uSupp, nSuppSize, k, Counter = 0;
    pTruth = Hop_ManConvertAigToTruth( pNtk->pManHop, Hop_Regular(pObj->pFunc), Nwk_ObjFaninNum(pObj), vTruth, 0 );
    nSuppSize = Kit_TruthSupportSize(pTruth, Nwk_ObjFaninNum(pObj));
    if ( nSuppSize == Nwk_ObjFaninNum(pObj) )
        return 0;
    Counter++;
    uSupp = Kit_TruthSupport( pTruth, Nwk_ObjFaninNum(pObj) );
    // create new node with the given support
    pObjNew = Nwk_ManCreateNode( pNtk, nSuppSize, Nwk_ObjFanoutNum(pObj) );
    Nwk_ObjForEachFanin( pObj, pFanin, k )
        if ( uSupp & (1 << k) )
            Nwk_ObjAddFanin( pObjNew, pFanin );
    pObjNew->pFunc = Hop_Remap( pNtk->pManHop, pObj->pFunc, uSupp, Nwk_ObjFaninNum(pObj) );
    if ( fVerbose )
        printf( "Reducing node %d fanins from %d to %d.\n", 
            pObj->Id, Nwk_ObjFaninNum(pObj), Nwk_ObjFaninNum(pObjNew) );
    Nwk_ObjReplace( pObj, pObjNew );
    return 1;
}